

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setBuddy(QLabel *this,QWidget *buddy)

{
  bool bVar1;
  QLabelPrivate *pQVar2;
  long in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  Function unaff_retaddr;
  offset_in_QObject_to_subr in_stack_00000010;
  QLabelPrivate *d;
  QWidget *in_stack_ffffffffffffff78;
  Object *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  code *in_stack_ffffffffffffff98;
  Object *receiverPrivate;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  receiverPrivate = in_RDI;
  pQVar2 = d_func((QLabel *)0x5b24c5);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x5b24db);
  if (bVar1) {
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x5b24f2);
    QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QLabelPrivate::*)()>
              ((Object *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0,
               in_stack_ffffffffffffff80,0);
  }
  QPointer<QWidget>::operator=
            ((QPointer<QWidget> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (in_RSI != 0) {
    in_stack_ffffffffffffff98 = QObject::destroyed;
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QLabelPrivate::*)()>
              ((Object *)QLabelPrivate::buddyDeleted,in_stack_00000010,receiverPrivate,unaff_retaddr
               ,(ConnectionType)((ulong)in_RSI >> 0x20));
    QMetaObject::Connection::~Connection(&local_10);
  }
  if ((*(ushort *)&pQVar2->field_0x340 >> 4 & 1) != 0) {
    if (pQVar2->shortcutId != 0) {
      QWidget::releaseShortcut((QWidget *)in_RDI,in_stack_ffffffffffffff8c);
    }
    pQVar2->shortcutId = 0;
    *(ushort *)&pQVar2->field_0x340 = *(ushort *)&pQVar2->field_0x340 & 0xfff7 | 8;
    if (in_RSI != 0) {
      QLabelPrivate::updateShortcut((QLabelPrivate *)in_stack_ffffffffffffff98);
    }
    QLabelPrivate::updateLabel((QLabelPrivate *)in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::setBuddy(QWidget *buddy)
{
    Q_D(QLabel);

    if (d->buddy)
        QObjectPrivate::disconnect(d->buddy, &QObject::destroyed,
                                   d, &QLabelPrivate::buddyDeleted);

    d->buddy = buddy;

    if (buddy)
        QObjectPrivate::connect(buddy, &QObject::destroyed,
                                d, &QLabelPrivate::buddyDeleted);

    if (d->isTextLabel) {
        if (d->shortcutId)
            releaseShortcut(d->shortcutId);
        d->shortcutId = 0;
        d->textDirty = true;
        if (buddy)
            d->updateShortcut(); // grab new shortcut
        d->updateLabel();
    }
}